

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyFileImpl::fileOpenFinished(QNetworkReplyFileImpl *this,bool isOpen)

{
  qint64 _t1;
  undefined7 in_register_00000031;
  
  QNetworkReply::setFinished((QNetworkReply *)this,true);
  if ((int)CONCAT71(in_register_00000031,isOpen) != 0) {
    _t1 = (**(code **)(*(long *)this + 0x80))(this);
    QNetworkReply::metaDataChanged((QNetworkReply *)this);
    QNetworkReply::downloadProgress((QNetworkReply *)this,_t1,_t1);
    QIODevice::readyRead();
  }
  QNetworkReply::finished((QNetworkReply *)this);
  return;
}

Assistant:

void QNetworkReplyFileImpl::fileOpenFinished(bool isOpen)
{
    setFinished(true);
    if (isOpen) {
        const auto fileSize = size();
        Q_EMIT metaDataChanged();
        Q_EMIT downloadProgress(fileSize, fileSize);
        Q_EMIT readyRead();
    }
    Q_EMIT finished();
}